

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

bool __thiscall
Hpipe::CppEmitter::bench
          (CppEmitter *this,
          vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *tds)

{
  string *first_beg;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  reference pTVar4;
  ostream *poVar5;
  reference pcVar6;
  StreamSep *pSVar7;
  bool local_17b2;
  allocator local_1691;
  string local_1690;
  byte local_1669;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1668;
  byte local_1643;
  byte local_1642;
  allocator local_1641;
  string local_1640;
  byte local_1619;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1618;
  byte local_15f3;
  byte local_15f2;
  allocator local_15f1;
  string local_15f0;
  string local_15d0;
  allocator local_15a9;
  undefined1 local_15a8 [8];
  string gpp;
  string gpp_1;
  undefined1 local_1420 [7];
  bool clang;
  unsigned_long local_13d8;
  reference local_13d0;
  reference local_13c8;
  StreamSep local_13c0;
  reference local_1378;
  TrainingData *td_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *__range1_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1350;
  char c_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  string *__range2_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_1330;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  TrainingData *td;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *__range1;
  StreamSep local_12b0;
  StreamSep local_1268;
  StreamSep local_1220;
  StreamSep local_11d8;
  StreamSep local_1190;
  StreamSep local_1148;
  StreamSep local_1100;
  StreamSep local_10b8;
  StreamSep local_1070;
  StreamSep local_1028;
  StreamSep local_fe0;
  StreamSep local_f98;
  StreamSep local_f50;
  StreamSep local_f08;
  StreamSep local_ec0;
  StreamSep local_e78;
  StreamSep local_e30;
  StreamSep local_de8;
  StreamSep local_da0;
  StreamSep local_d58;
  StreamSep local_d10;
  StreamSep local_cc8;
  StreamSep local_c80;
  StreamSep local_c38;
  StreamSep local_bf0;
  StreamSep local_ba8;
  StreamSep local_b60;
  StreamSep local_b18;
  StreamSep local_ad0;
  StreamSep local_a88;
  StreamSep local_a40;
  StreamSep local_9f8;
  StreamSep local_9b0;
  StreamSep local_968;
  StreamSep local_920;
  StreamSep local_8d8;
  StreamSep local_890;
  StreamSep local_848;
  StreamSep local_800;
  StreamSep local_7b8;
  StreamSep local_770;
  StreamSep local_728;
  StreamSep local_6e0;
  StreamSep local_698;
  StreamSep local_650;
  StreamSep local_608;
  StreamSep local_5c0;
  StreamSep local_578;
  StreamSep local_530;
  StreamSep local_4e8;
  StreamSep local_4a0;
  string local_458;
  allocator local_431;
  string local_430;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  undefined1 local_3c8 [8];
  StreamSepMaker ns;
  allocator local_309;
  string local_308;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  StreamSepMaker ss;
  ofstream fout;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *tds_local;
  CppEmitter *this_local;
  
  std::ofstream::ofstream((undefined1 *)((long)&ss.end.field_2 + 8),"bench.cpp",0x10);
  std::__cxx11::string::string((string *)&local_2c8);
  std::__cxx11::string::string((string *)&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_308,"\n",&local_309);
  first_beg = (string *)(ns.end.field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)first_beg);
  StreamSepMaker::StreamSepMaker
            ((StreamSepMaker *)local_2a8,(TS *)(ss.end.field_2._M_local_buf + 8),&local_2c8,
             &local_2e8,&local_308,first_beg);
  std::__cxx11::string::~string((string *)(ns.end.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"    ",&local_3e9);
  std::__cxx11::string::string((string *)&local_410);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"\n",&local_431);
  std::__cxx11::string::string((string *)&local_458);
  StreamSepMaker::StreamSepMaker
            ((StreamSepMaker *)local_3c8,(TS *)(ss.end.field_2._M_local_buf + 8),&local_3e8,
             &local_410,&local_430,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  StreamSepMaker::operator<<
            (&local_4a0,(StreamSepMaker *)local_2a8,(char (*) [31])"#include <Hpipe/CbStringPtr.h>")
  ;
  StreamSep::~StreamSep(&local_4a0);
  StreamSepMaker::operator<<
            (&local_4e8,(StreamSepMaker *)local_2a8,(char (*) [25])"#include <Hpipe/Print.h>");
  StreamSep::~StreamSep(&local_4e8);
  StreamSepMaker::operator<<
            (&local_530,(StreamSepMaker *)local_2a8,(char (*) [20])"#include <iostream>");
  StreamSep::~StreamSep(&local_530);
  StreamSepMaker::operator<<
            (&local_578,(StreamSepMaker *)local_2a8,(char (*) [19])"#include <sstream>");
  StreamSep::~StreamSep(&local_578);
  StreamSepMaker::operator<<
            (&local_5c0,(StreamSepMaker *)local_2a8,(char (*) [17])"#include <ctime>");
  StreamSep::~StreamSep(&local_5c0);
  StreamSepMaker::operator<<(&local_608,(StreamSepMaker *)local_2a8,(char (*) [1])0x247135);
  StreamSep::~StreamSep(&local_608);
  StreamSepMaker::operator<<
            (&local_650,(StreamSepMaker *)local_2a8,
             (char (*) [40])"#define HPIPE_DEFINITION_PREFIX Bench::");
  StreamSep::~StreamSep(&local_650);
  StreamSepMaker::operator<<(&local_698,(StreamSepMaker *)local_2a8,(char (*) [1])0x247135);
  StreamSep::~StreamSep(&local_698);
  write_preliminaries(this,(StreamSepMaker *)local_2a8);
  StreamSepMaker::operator<<(&local_6e0,(StreamSepMaker *)local_2a8,(char (*) [1])0x247135);
  StreamSep::~StreamSep(&local_6e0);
  StreamSepMaker::operator<<(&local_728,(StreamSepMaker *)local_2a8,(char (*) [15])"struct Bench {")
  ;
  StreamSep::~StreamSep(&local_728);
  StreamSepMaker::operator<<
            (&local_770,(StreamSepMaker *)local_2a8,
             (char (*) [107])
             "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );"
            );
  StreamSep::~StreamSep(&local_770);
  write_declarations(this,(StreamSepMaker *)local_3c8);
  StreamSepMaker::operator<<
            (&local_7b8,(StreamSepMaker *)local_2a8,(char (*) [27])"    std::ostringstream os;");
  StreamSep::~StreamSep(&local_7b8);
  StreamSepMaker::operator<<
            (&local_800,(StreamSepMaker *)local_2a8,(char (*) [26])"    HpipeData hpipe_data;");
  StreamSep::~StreamSep(&local_800);
  StreamSepMaker::operator<<
            (&local_848,(StreamSepMaker *)local_2a8,(char (*) [22])"    unsigned cpt = 0;");
  StreamSep::~StreamSep(&local_848);
  StreamSepMaker::operator<<(&local_890,(StreamSepMaker *)local_2a8,(char (*) [3])"};");
  StreamSep::~StreamSep(&local_890);
  StreamSepMaker::operator<<
            (&local_8d8,(StreamSepMaker *)local_2a8,
             (char (*) [111])
             "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {"
            );
  StreamSep::~StreamSep(&local_8d8);
  switch(this->buffer_type) {
  case 0:
    StreamSepMaker::operator<<
              (&local_920,(StreamSepMaker *)local_3c8,
               (char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_920);
    StreamSepMaker::operator<<
              (&local_968,(StreamSepMaker *)local_3c8,
               (char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_968);
    StreamSepMaker::operator<<
              (&local_9b0,(StreamSepMaker *)local_3c8,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_9b0);
    StreamSepMaker::operator<<
              (&local_9f8,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_9f8);
    StreamSepMaker::operator<<
              (&local_a40,(StreamSepMaker *)local_3c8,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_a40);
    StreamSepMaker::operator<<
              (&local_a88,(StreamSepMaker *)local_3c8,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_a88);
    StreamSepMaker::operator<<
              (&local_ad0,(StreamSepMaker *)local_3c8,(char (*) [27])"    parse( buf, 0, size );");
    StreamSep::~StreamSep(&local_ad0);
    StreamSepMaker::operator<<(&local_b18,(StreamSepMaker *)local_3c8,(char (*) [2])0x24a292);
    StreamSep::~StreamSep(&local_b18);
    StreamSepMaker::operator<<
              (&local_b60,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_b60);
    StreamSepMaker::operator<<(&local_ba8,(StreamSepMaker *)local_3c8,(char (*) [30])0x24943b);
    StreamSep::~StreamSep(&local_ba8);
    break;
  case 1:
    StreamSepMaker::operator<<
              (&local_bf0,(StreamSepMaker *)local_3c8,
               (char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_bf0);
    StreamSepMaker::operator<<
              (&local_c38,(StreamSepMaker *)local_3c8,
               (char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_c38);
    StreamSepMaker::operator<<
              (&local_c80,(StreamSepMaker *)local_3c8,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_c80);
    StreamSepMaker::operator<<
              (&local_cc8,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_cc8);
    StreamSepMaker::operator<<
              (&local_d10,(StreamSepMaker *)local_3c8,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_d10);
    StreamSepMaker::operator<<
              (&local_d58,(StreamSepMaker *)local_3c8,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_d58);
    StreamSepMaker::operator<<
              (&local_da0,(StreamSepMaker *)local_3c8,(char (*) [24])"    parse( buf, true );");
    StreamSep::~StreamSep(&local_da0);
    StreamSepMaker::operator<<(&local_de8,(StreamSepMaker *)local_3c8,(char (*) [2])0x24a292);
    StreamSep::~StreamSep(&local_de8);
    StreamSepMaker::operator<<
              (&local_e30,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_e30);
    StreamSepMaker::operator<<(&local_e78,(StreamSepMaker *)local_3c8,(char (*) [30])0x24943b);
    StreamSep::~StreamSep(&local_e78);
    break;
  case 2:
    StreamSepMaker::operator<<
              (&local_ec0,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_ec0);
    StreamSepMaker::operator<<
              (&local_f08,(StreamSepMaker *)local_3c8,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_f08);
    StreamSepMaker::operator<<
              (&local_f50,(StreamSepMaker *)local_3c8,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_f50);
    StreamSepMaker::operator<<
              (&local_f98,(StreamSepMaker *)local_3c8,
               (char (*) [36])"    parse( data, data - 1 + size );");
    StreamSep::~StreamSep(&local_f98);
    StreamSepMaker::operator<<(&local_fe0,(StreamSepMaker *)local_3c8,(char (*) [2])0x24a292);
    StreamSep::~StreamSep(&local_fe0);
    StreamSepMaker::operator<<
              (&local_1028,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_1028);
    break;
  case 3:
    StreamSepMaker::operator<<
              (&local_1070,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_1070);
    StreamSepMaker::operator<<
              (&local_10b8,(StreamSepMaker *)local_3c8,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_10b8);
    StreamSepMaker::operator<<
              (&local_1100,(StreamSepMaker *)local_3c8,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_1100);
    StreamSepMaker::operator<<
              (&local_1148,(StreamSepMaker *)local_3c8,(char (*) [19])"    parse( data );");
    StreamSep::~StreamSep(&local_1148);
    StreamSepMaker::operator<<(&local_1190,(StreamSepMaker *)local_3c8,(char (*) [2])0x24a292);
    StreamSep::~StreamSep(&local_1190);
    StreamSepMaker::operator<<
              (&local_11d8,(StreamSepMaker *)local_3c8,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_11d8);
  }
  StreamSepMaker::operator<<
            (&local_1220,(StreamSepMaker *)local_2a8,(char (*) [19])"    if ( display )");
  StreamSep::~StreamSep(&local_1220);
  StreamSepMaker::operator<<
            (&local_1268,(StreamSepMaker *)local_2a8,
             (char (*) [107])
             "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;"
            );
  StreamSep::~StreamSep(&local_1268);
  StreamSepMaker::operator<<(&local_12b0,(StreamSepMaker *)local_2a8,(char (*) [2])0x24a292);
  StreamSep::~StreamSep(&local_12b0);
  write_definitions(this,(StreamSepMaker *)local_2a8);
  StreamSepMaker::operator<<
            ((StreamSep *)&__range1,(StreamSepMaker *)local_2a8,
             (char (*) [36])"int main( int argc, char **argv ) {");
  StreamSep::~StreamSep((StreamSep *)&__range1);
  __end1 = std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
           begin(tds);
  td = (TrainingData *)
       std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::end
                 (tds);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
                                     *)&td), bVar2) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
             ::operator*(&__end1);
    poVar5 = std::operator<<((ostream *)local_2a8,"    static unsigned char name_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4);
    std::operator<<(poVar5,"[] = { ");
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_1330._M_current = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffecd0), bVar2) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      poVar5 = (ostream *)std::ostream::operator<<((void *)local_2a8,(int)*pcVar6);
      std::operator<<(poVar5,",");
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    std::operator<<((ostream *)local_2a8," 0 };\n");
    poVar5 = std::operator<<((ostream *)local_2a8,"    static unsigned char inp_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4);
    std::operator<<(poVar5,"[] = { ");
    __end2_1._M_current = (char *)std::__cxx11::string::begin();
    _Stack_1350._M_current = (char *)std::__cxx11::string::end();
    while (bVar2 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffecb0), bVar2) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2_1);
      poVar5 = (ostream *)std::ostream::operator<<((void *)local_2a8,(int)*pcVar6);
      std::operator<<(poVar5,",");
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2_1);
    }
    std::operator<<((ostream *)local_2a8," 0 };\n");
    poVar5 = std::operator<<((ostream *)local_2a8,"    static double freq_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4);
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4->freq);
    std::operator<<(poVar5,";\n");
    __gnu_cxx::
    __normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::
             begin(tds);
  td_1 = (TrainingData *)
         std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>::end
                   (tds);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
                             *)&td_1), bVar2) {
    local_1378 = __gnu_cxx::
                 __normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
                 ::operator*(&__end1_1);
    StreamSepMaker::operator<<
              (&local_13c0,(StreamSepMaker *)local_2a8,(char (*) [24])"    Bench().exec( name_");
    local_13c8 = local_1378;
    pSVar7 = StreamSep::operator<<(&local_13c0,&local_13c8);
    pSVar7 = StreamSep::operator<<(pSVar7,(char (*) [7])", inp_");
    local_13d0 = local_1378;
    pSVar7 = StreamSep::operator<<(pSVar7,&local_13d0);
    pSVar7 = StreamSep::operator<<(pSVar7,(char (*) [3])0x24b8a5);
    local_13d8 = std::__cxx11::string::size();
    pSVar7 = StreamSep::operator<<(pSVar7,&local_13d8);
    StreamSep::operator<<(pSVar7,(char (*) [30])", argc > 1 ? argv[ 1 ] : 0 );");
    StreamSep::~StreamSep(&local_13c0);
    __gnu_cxx::
    __normal_iterator<const_Hpipe::Lexer::TrainingData_*,_std::vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>_>
    ::operator++(&__end1_1);
  }
  StreamSepMaker::operator<<
            ((StreamSep *)local_1420,(StreamSepMaker *)local_2a8,(char (*) [2])0x24a292);
  StreamSep::~StreamSep((StreamSep *)local_1420);
  std::ofstream::close();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_15a8,"g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp",
             &local_15a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_15a9);
  local_15f2 = 0;
  local_15f3 = 0;
  local_1619 = 0;
  local_1642 = 0;
  local_1643 = 0;
  local_1669 = 0;
  bVar1 = false;
  bVar2 = false;
  std::__cxx11::string::string((string *)&local_15d0,(string *)local_15a8);
  bVar3 = anon_unknown_10::_exec(&local_15d0,true);
  local_17b2 = false;
  if (bVar3) {
    std::allocator<char>::allocator();
    local_15f2 = 1;
    std::__cxx11::string::string((string *)&local_15f0,"./bench \'without profile\'",&local_15f1);
    local_15f3 = 1;
    bVar3 = anon_unknown_10::_exec(&local_15f0,true);
    local_17b2 = false;
    if (bVar3) {
      std::operator+(&local_1618,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_15a8
                     ," -fprofile-generate");
      local_1619 = 1;
      bVar3 = anon_unknown_10::_exec(&local_1618,true);
      local_17b2 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_1642 = 1;
        std::__cxx11::string::string((string *)&local_1640,"./bench",&local_1641);
        local_1643 = 1;
        bVar3 = anon_unknown_10::_exec(&local_1640,true);
        local_17b2 = false;
        if (bVar3) {
          std::operator+(&local_1668,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_15a8," -fprofile-use");
          local_1669 = 1;
          bVar3 = anon_unknown_10::_exec(&local_1668,true);
          local_17b2 = false;
          if (bVar3) {
            std::allocator<char>::allocator();
            bVar1 = true;
            std::__cxx11::string::string
                      ((string *)&local_1690,"./bench \'with profile\'",&local_1691);
            bVar2 = true;
            local_17b2 = anon_unknown_10::_exec(&local_1690,true);
          }
        }
      }
    }
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_1690);
  }
  if (bVar1) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1691);
  }
  if ((local_1669 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1668);
  }
  if ((local_1643 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1640);
  }
  if ((local_1642 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1641);
  }
  if ((local_1619 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1618);
  }
  if ((local_15f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_15f0);
  }
  if ((local_15f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_15f1);
  }
  std::__cxx11::string::~string((string *)&local_15d0);
  gpp.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_15a8);
  StreamSepMaker::~StreamSepMaker((StreamSepMaker *)local_3c8);
  StreamSepMaker::~StreamSepMaker((StreamSepMaker *)local_2a8);
  std::ofstream::~ofstream((void *)((long)&ss.end.field_2 + 8));
  return local_17b2;
}

Assistant:

bool CppEmitter::bench(const std::vector<Lexer::TrainingData> &tds) {
    std::ofstream fout( "bench.cpp" );
    StreamSepMaker ss( fout );
    StreamSepMaker ns( fout, "    " );
    ss << "#include <Hpipe/CbStringPtr.h>";
    ss << "#include <Hpipe/Print.h>";
    ss << "#include <iostream>";
    ss << "#include <sstream>";
    ss << "#include <ctime>";    
    ss << "";
    ss << "#define HPIPE_DEFINITION_PREFIX Bench::";
    ss << "";
    write_preliminaries( ss );
    ss << "";
    ss << "struct Bench {";
    ss << "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );";
    write_declarations( ns );
    ss << "    std::ostringstream os;";
    ss << "    HpipeData hpipe_data;";
    ss << "    unsigned cpt = 0;";
    ss << "};";

    ss << "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {";
    switch ( buffer_type ) {
    case BT_HPIPE_CB_STRING_PTR:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, 0, size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_HPIPE_BUFFER:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, true );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_BEG_END:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data, data - 1 + size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    case BT_C_STR:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    }
    ss << "    if ( display )";
    ss << "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;";
    ss << "}";

    write_definitions( ss );

    ss << "int main( int argc, char **argv ) {";
    for( const Lexer::TrainingData &td : tds ) {
        *ss.stream << "    static unsigned char name_" << &td << "[] = { "; for( char c : td.name ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static unsigned char inp_"  << &td << "[] = { "; for( char c : td.inp  ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static double freq_"        << &td << " = " << td.freq << ";\n";
    }
    for( const Lexer::TrainingData &td : tds )
        ss << "    Bench().exec( name_" << &td << ", inp_" << &td << ", " << td.inp.size() << ", argc > 1 ? argv[ 1 ] : 0 );";
    ss << "}";
    fout.close();

    bool clang = false;
    if ( clang ) {
        std::string gpp = "clang++ -O3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
        return _exec( gpp ) && _exec( "echo without profile", false ) && _exec( "./bench 'without profile'" ) &&
               _exec( gpp + " -fprofile-instr-generate" ) && _exec( "./bench -nodisp" ) &&
               _exec( "llvm-profdata-3.8 merge -output=default.profdata default.profraw" ) &&
               _exec( gpp + " -fprofile-instr-use"      ) && _exec( "./bench 'with profile'" );
    }

    //std::string gpp = "g++ -O6 -g3 -fno-reorder-blocks -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    std::string gpp = "g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    return _exec( gpp ) && _exec( "./bench 'without profile'" )
        && _exec( gpp + " -fprofile-generate" ) && _exec( "./bench" )
        && _exec( gpp + " -fprofile-use"      ) && _exec( "./bench 'with profile'" )
            ; // -fno-reorder-blocks-and-partition
}